

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void hw_breakpoint_update_all_arm(ARMCPU *cpu)

{
  CPUARMState *env;
  int i;
  ARMCPU *cpu_local;
  
  cpu_breakpoint_remove_all_arm(&cpu->parent_obj,0x20);
  memset((cpu->env).cpu_breakpoint,0,0x80);
  for (env._4_4_ = 0; env._4_4_ < 0x10; env._4_4_ = env._4_4_ + 1) {
    hw_breakpoint_update_arm(cpu,env._4_4_);
  }
  return;
}

Assistant:

void hw_breakpoint_update_all(ARMCPU *cpu)
{
    int i;
    CPUARMState *env = &cpu->env;

    /* Completely clear out existing QEMU breakpoints and our array, to
     * avoid possible stale entries following migration load.
     */
    cpu_breakpoint_remove_all(CPU(cpu), BP_CPU);
    memset(env->cpu_breakpoint, 0, sizeof(env->cpu_breakpoint));

    for (i = 0; i < ARRAY_SIZE(cpu->env.cpu_breakpoint); i++) {
        hw_breakpoint_update(cpu, i);
    }
}